

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<unsigned_long>::Reserve
          (RepeatedField<unsigned_long> *this,int new_size)

{
  ulong n;
  int iVar1;
  Rep *pRVar2;
  uint uVar3;
  Rep *pRVar4;
  ulong uVar5;
  Arena *this_00;
  
  if (this->total_size_ < new_size) {
    pRVar2 = this->rep_;
    if (pRVar2 == (Rep *)0x0) {
      this_00 = (Arena *)0x0;
    }
    else {
      this_00 = pRVar2->arena;
    }
    uVar3 = this->total_size_ * 2;
    if ((int)uVar3 <= new_size) {
      uVar3 = new_size;
    }
    uVar5 = 4;
    if (4 < (int)uVar3) {
      uVar5 = (ulong)uVar3;
    }
    n = uVar5 * 8 + 8;
    if (this_00 == (Arena *)0x0) {
      pRVar4 = (Rep *)operator_new(n);
    }
    else {
      pRVar4 = (Rep *)Arena::AllocateAligned(this_00,(type_info *)&char::typeinfo,n);
    }
    this->rep_ = pRVar4;
    pRVar4->arena = this_00;
    iVar1 = this->total_size_;
    this->total_size_ = (int)uVar5;
    if (0 < (long)this->current_size_) {
      memcpy(pRVar4->elements,pRVar2->elements,(long)this->current_size_ << 3);
    }
    if ((pRVar2 != (Rep *)0x0) && (pRVar2->arena == (Arena *)0x0)) {
      operator_delete(pRVar2,(long)iVar1 * 8 + 8);
      return;
    }
  }
  return;
}

Assistant:

void RepeatedField<Element>::Reserve(int new_size) {
  if (total_size_ >= new_size) return;
  Rep* old_rep = rep_;
  Arena* arena = GetArenaNoVirtual();
  new_size = std::max(google::protobuf::internal::kMinRepeatedFieldAllocationSize,
                      std::max(total_size_ * 2, new_size));
  GOOGLE_DCHECK_LE(
      static_cast<size_t>(new_size),
      (std::numeric_limits<size_t>::max() - kRepHeaderSize) / sizeof(Element))
      << "Requested size is too large to fit into size_t.";
  size_t bytes = kRepHeaderSize + sizeof(Element) * new_size;
  if (arena == NULL) {
    rep_ = static_cast<Rep*>(::operator new(bytes));
  } else {
    rep_ = reinterpret_cast<Rep*>(
            ::google::protobuf::Arena::CreateArray<char>(arena, bytes));
  }
  rep_->arena = arena;
  int old_total_size = total_size_;
  total_size_ = new_size;
  // Invoke placement-new on newly allocated elements. We shouldn't have to do
  // this, since Element is supposed to be POD, but a previous version of this
  // code allocated storage with "new Element[size]" and some code uses
  // RepeatedField with non-POD types, relying on constructor invocation. If
  // Element has a trivial constructor (e.g., int32), gcc (tested with -O2)
  // completely removes this loop because the loop body is empty, so this has no
  // effect unless its side-effects are required for correctness.
  // Note that we do this before MoveArray() below because Element's copy
  // assignment implementation will want an initialized instance first.
  Element* e = &rep_->elements[0];
  Element* limit = &rep_->elements[total_size_];
  for (; e < limit; e++) {
    new (e) Element;
  }
  if (current_size_ > 0) {
    MoveArray(rep_->elements, old_rep->elements, current_size_);
  }

  // Likewise, we need to invoke destructors on the old array.
  InternalDeallocate(old_rep, old_total_size);

}